

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_32f1a0::Db::parseCallOffset(Db *this)

{
  bool bVar1;
  byte local_52;
  byte local_51;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  Db *local_18;
  Db *this_local;
  
  local_18 = this;
  bVar1 = consumeIf(this,'h');
  if (bVar1) {
    local_28 = parseNumber(this,true);
    bVar1 = StringView::empty(&local_28);
    local_51 = 1;
    if (!bVar1) {
      bVar1 = consumeIf(this,'_');
      local_51 = bVar1 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_51 & 1);
  }
  else {
    bVar1 = consumeIf(this,'v');
    if (bVar1) {
      local_38 = parseNumber(this,true);
      bVar1 = StringView::empty(&local_38);
      local_52 = 1;
      if (!bVar1) {
        bVar1 = consumeIf(this,'_');
        local_52 = 1;
        if (bVar1) {
          local_48 = parseNumber(this,true);
          bVar1 = StringView::empty(&local_48);
          local_52 = 1;
          if (!bVar1) {
            bVar1 = consumeIf(this,'_');
            local_52 = bVar1 ^ 0xff;
          }
        }
      }
      this_local._7_1_ = (bool)(local_52 & 1);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Db::parseCallOffset() {
  // Just scan through the call offset, we never add this information into the
  // output.
  if (consumeIf('h'))
    return parseNumber(true).empty() || !consumeIf('_');
  if (consumeIf('v'))
    return parseNumber(true).empty() || !consumeIf('_') ||
           parseNumber(true).empty() || !consumeIf('_');
  return true;
}